

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.hpp
# Opt level: O2

void nestl::test::
     CheckSetSize<nestl::impl::set<int,std::less<int>,nestl::test::minimal_allocator<int>>>
               (set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *s,
               size_t expectedSize)

{
  rb_tree_node_base *prVar1;
  size_t sVar2;
  bool setIsEmpty;
  bool shouldBeEmpty;
  size_t dist;
  size_t cdist;
  bool local_2a;
  bool local_29;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  
  sVar2 = (s->m_impl).m_impl.m_node_count;
  local_28 = expectedSize;
  if (sVar2 != expectedSize) {
    local_20 = sVar2;
    fatal_failure<char_const(&)[16],unsigned_long&,char_const(&)[8],unsigned_long>
              ((char (*) [16])"expected size: ",&local_28,(char (*) [8])", got: ",&local_20);
    expectedSize = (s->m_impl).m_impl.m_node_count;
  }
  local_29 = local_28 == 0;
  local_2a = expectedSize == 0;
  if (local_29 != local_2a) {
    fatal_failure<char_const(&)[26],bool&,char_const(&)[22],bool&>
              ((char (*) [26])"set empty method returns ",&local_2a,
               (char (*) [22])", while it should be ",&local_29);
  }
  prVar1 = &(s->m_impl).m_impl.m_header;
  local_20 = std::__distance<nestl::impl::detail::rb_tree_const_iterator<int>>
                       ((s->m_impl).m_impl.m_header.m_left,prVar1);
  if (local_20 != local_28) {
    fatal_failure<char_const(&)[38],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((char (*) [38])"distance between iterators should be ",&local_28,
               (char (*) [16])" elements, got ",&local_20,(char (*) [10])" elements");
  }
  local_18 = std::__distance<nestl::impl::detail::rb_tree_const_iterator<int>>
                       ((s->m_impl).m_impl.m_header.m_left,prVar1);
  if (local_18 != local_28) {
    fatal_failure<char_const(&)[44],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((char (*) [44])"distance between const iterators should be ",&local_28,
               (char (*) [16])" elements, got ",&local_18,(char (*) [10])" elements");
  }
  return;
}

Assistant:

void CheckSetSize(const Set& s, size_t expectedSize)
{
    if (s.size() != expectedSize)
    {
        fatal_failure("expected size: ", expectedSize, ", got: ", s.size());
    }

    bool shouldBeEmpty = (expectedSize == 0);
    bool setIsEmpty = s.empty();

    if (setIsEmpty != shouldBeEmpty)
    {
        fatal_failure("set empty method returns ", setIsEmpty, ", while it should be ", shouldBeEmpty);
    }

    size_t dist = std::distance(s.begin(), s.end());
    if (dist != expectedSize)
    {
        fatal_failure("distance between iterators should be ", expectedSize, " elements, got ", dist, " elements");
    }

    size_t cdist = std::distance(s.cbegin(), s.cend());
    if (cdist != expectedSize)
    {
        fatal_failure("distance between const iterators should be " ,expectedSize, " elements, got ", cdist, " elements");
    }
}